

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sexp.c
# Opt level: O2

sexp sexp_user_exception(sexp ctx,sexp self,char *ms,sexp ir)

{
  sexp psVar1;
  sexp message;
  sexp_sint_t n;
  sexp irr;
  sexp str;
  sexp_gc_var_t local_68;
  sexp sym;
  sexp_gc_var_t local_50;
  sexp_gc_var_t local_40;
  
  local_68.var = &sym;
  sym = (sexp)&DAT_0000043e;
  local_40.var = &str;
  str = (sexp)&DAT_0000043e;
  local_50.var = &irr;
  irr = (sexp)&DAT_0000043e;
  local_40.next = &local_68;
  local_68.next = (ctx->value).context.saves;
  local_50.next = &local_40;
  (ctx->value).context.saves = &local_50;
  psVar1 = sexp_intern(ctx,"user",-1);
  sym = psVar1;
  message = sexp_c_string(ctx,ms,-1);
  str = message;
  if (((ulong)ir & 3) == 0) {
    if ((ir == (sexp)&DAT_0000023e) || (ir->tag == 6)) goto LAB_0010e538;
  }
  else if (ir == (sexp)&DAT_0000023e) {
    ir = (sexp)&DAT_0000023e;
    goto LAB_0010e538;
  }
  ir = sexp_cons_op(ctx,(sexp)ms,n,ir,(sexp)&DAT_0000023e);
  irr = ir;
LAB_0010e538:
  psVar1 = sexp_make_exception(ctx,psVar1,message,ir,self,(sexp)&DAT_0000003e);
  (ctx->value).context.saves = local_68.next;
  return psVar1;
}

Assistant:

sexp sexp_user_exception (sexp ctx, sexp self, const char *ms, sexp ir) {
  sexp res;
  sexp_gc_var3(sym, str, irr);
  sexp_gc_preserve3(ctx, sym, str, irr);
  res = sexp_make_exception(ctx, sym = sexp_intern(ctx, "user", -1),
                            str = sexp_c_string(ctx, ms, -1),
                            ((sexp_pairp(ir) || sexp_nullp(ir))
                             ? ir : (irr = sexp_list1(ctx, ir))),
                            self, SEXP_FALSE);
  sexp_gc_release3(ctx);
  return res;
}